

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_compilation.cpp
# Opt level: O3

void pstore::exchange::export_ns::emit_compilation
               (ostream_base *os,indent ind,database *db,compilation *compilation,
               string_mapping *strings,bool comments)

{
  uint uVar1;
  value_type vVar2;
  uint128 d;
  indent iVar3;
  uint uVar4;
  ostream_base *poVar5;
  char *pcVar6;
  typed_address<pstore::indirect_string> *ptVar7;
  compilation *__n;
  size_t __n_00;
  int __c;
  int __c_00;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *extraout_RDX;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  void *__buf_10;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *__buf_11;
  void *extraout_RDX_03;
  void *pvVar8;
  void *__buf_12;
  void *__buf_13;
  int __fd;
  undefined3 in_register_00000089;
  long lVar9;
  maybe<pstore::typed_address<pstore::indirect_string>,_void> prev_name;
  indent ind1;
  indent object_indent;
  undefined4 in_stack_ffffffffffffff98;
  bool bVar10;
  undefined7 in_stack_ffffffffffffffa1;
  indent local_4c;
  indent local_48;
  indent local_44;
  database *local_40;
  indent local_34;
  
  uVar4 = CONCAT31(in_register_00000089,comments);
  __n = compilation;
  local_4c.distance_ = ind.distance_;
  ostream_base::write(os,0x1249f8,db,(size_t)compilation);
  local_34.distance_ = ind.distance_ + 1;
  poVar5 = operator<<(os,&local_34);
  poVar5 = (ostream_base *)ostream_base::write(poVar5,0x125827,__buf,(size_t)__n);
  pcVar6 = string_mapping::index(strings,(char *)(compilation->triple_).a_.a_,__c);
  poVar5 = ostream_base::write<unsigned_long,void>(poVar5,(unsigned_long)pcVar6);
  ostream_base::write(poVar5,0x2c,__buf_00,(size_t)__n);
  __n_00 = (size_t)uVar4;
  local_40 = db;
  show_string(os,db,(typed_address<pstore::indirect_string>)(compilation->triple_).a_.a_,
              SUB41(uVar4,0));
  poVar5 = (ostream_base *)ostream_base::write(os,10,__buf_01,__n_00);
  poVar5 = operator<<(poVar5,&local_34);
  ostream_base::write(poVar5,0x125831,__buf_02,__n_00);
  iVar3.distance_ = local_34.distance_;
  uVar1 = compilation->size_;
  local_44.distance_ = local_34.distance_;
  ostream_base::write(os,0x124e1e,__buf_03,__n_00);
  local_48.distance_ = iVar3.distance_ + 1;
  bVar10 = false;
  pvVar8 = extraout_RDX;
  if ((ulong)uVar1 != 0) {
    __fd = 0x124119;
    lVar9 = 0;
    uVar4 = uVar4 & 0xff;
    do {
      ostream_base::write(os,__fd,pvVar8,__n_00);
      if (bVar10 == true) {
        ptVar7 = maybe<pstore::typed_address<pstore::indirect_string>,_void>::operator->
                           ((maybe<pstore::typed_address<pstore::indirect_string>,_void> *)
                            &stack0xffffffffffffffa0);
        __n_00 = (size_t)uVar4;
        show_string(os,local_40,(typed_address<pstore::indirect_string>)(ptVar7->a_).a_,
                    SUB41(uVar4,0));
        ostream_base::write(os,10,__buf_04,__n_00);
      }
      operator<<(os,&local_48);
      ostream_base::write(os,0x125840,__buf_05,__n_00);
      d.v_._4_4_ = uVar4;
      d.v_._0_4_ = in_stack_ffffffffffffff98;
      d.v_._8_1_ = bVar10;
      d.v_._9_7_ = in_stack_ffffffffffffffa1;
      emit_digest((export_ns *)os,*(ostream_base **)((long)(&compilation->signature_ + 4) + lVar9),d
                 );
      poVar5 = (ostream_base *)ostream_base::write(os,0x12584b,__buf_06,__n_00);
      pcVar6 = string_mapping::index
                         (strings,*(char **)((long)(&compilation->signature_ + 8) + lVar9),__c_00);
      poVar5 = ostream_base::write<unsigned_long,void>(poVar5,(unsigned_long)pcVar6);
      poVar5 = (ostream_base *)ostream_base::write(poVar5,0x125854,__buf_07,__n_00);
      poVar5 = repo::operator<<(poVar5,*(linkage *)((long)(&compilation->signature_ + 9) + lVar9) &
                                       (weak_odr|weak_any));
      ostream_base::write(poVar5,0x22,__buf_08,__n_00);
      pvVar8 = __buf_09;
      if ((*(byte *)((long)(&compilation->signature_ + 9) + lVar9) & 0x30) != 0) {
        poVar5 = (ostream_base *)ostream_base::write(os,0x125861,__buf_09,__n_00);
        __n_00 = (size_t)(*(byte *)((long)(&compilation->signature_ + 9) + lVar9) >> 2 & 0xc);
        poVar5 = (ostream_base *)
                 ostream_base::write(poVar5,*(int *)(&DAT_001259c0 + __n_00) + 0x1259c0,
                                     &DAT_001259c0,__n_00);
        ostream_base::write(poVar5,0x22,__buf_10,__n_00);
        pvVar8 = extraout_RDX_00;
      }
      ostream_base::write(os,0x7d,pvVar8,__n_00);
      vVar2 = *(value_type *)((long)(&compilation->signature_ + 8) + lVar9);
      if (bVar10 == true) {
        ptVar7 = maybe<pstore::typed_address<pstore::indirect_string>,void>::
                 value_impl<pstore::maybe<pstore::typed_address<pstore::indirect_string>,void>&,pstore::typed_address<pstore::indirect_string>>
                           ((maybe<pstore::typed_address<pstore::indirect_string>,_void> *)
                            &stack0xffffffffffffffa0);
        (ptVar7->a_).a_ = vVar2;
        pvVar8 = extraout_RDX_02;
      }
      else {
        bVar10 = true;
        pvVar8 = extraout_RDX_01;
      }
      lVar9 = lVar9 + 0x30;
      __fd = 0x124a06;
    } while ((ulong)uVar1 * 0x30 != lVar9);
    if ((bVar10 & 1U) != 0) {
      ptVar7 = maybe<pstore::typed_address<pstore::indirect_string>,_void>::operator->
                         ((maybe<pstore::typed_address<pstore::indirect_string>,_void> *)
                          &stack0xffffffffffffffa0);
      __n_00 = (size_t)uVar4;
      show_string(os,local_40,(typed_address<pstore::indirect_string>)(ptVar7->a_).a_,SUB41(uVar4,0)
                 );
      poVar5 = (ostream_base *)ostream_base::write(os,10,__buf_11,__n_00);
      operator<<(poVar5,&local_44);
      pvVar8 = extraout_RDX_03;
    }
  }
  ostream_base::write(os,0x5d,pvVar8,__n_00);
  poVar5 = (ostream_base *)ostream_base::write(os,10,__buf_12,__n_00);
  poVar5 = operator<<(poVar5,&local_4c);
  ostream_base::write(poVar5,0x7d,__buf_13,__n_00);
  return;
}

Assistant:

void emit_compilation (ostream_base & os, indent const ind, database const & db,
                                   repo::compilation const & compilation,
                                   string_mapping const & strings, bool const comments) {
                os << "{\n";
                auto const object_indent = ind.next ();
                os << object_indent << R"("triple":)" << strings.index (compilation.triple ())
                   << ',';
                show_string (os, db, compilation.triple (), comments);
                os << '\n' << object_indent << R"("definitions":)";
                emit_array_with_name (os, object_indent, db, compilation.begin (),
                                      compilation.end (), comments,
                                      [&] (ostream_base & os1, repo::definition const & d) {
                                          os1 << R"({"digest":)";
                                          emit_digest (os1, d.digest);
                                          os1 << R"(,"name":)" << strings.index (d.name)
                                              << R"(,"linkage":")" << d.linkage () << '"';
                                          if (d.visibility () != repo::visibility::default_vis) {
                                              os1 << R"(,"visibility":")" << d.visibility () << '"';
                                          }
                                          os1 << '}';
                                          return d.name;
                                      });
                os << '\n' << ind << '}';
            }